

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool range_contains(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_fiber_t *fiber;
  bool local_1069;
  char local_1048 [8];
  char _buffer [4096];
  gravity_value_t value;
  gravity_range_t *range;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  if (args[1].isa == gravity_class_int) {
    local_1069 = false;
    if ((long)((args->field_1).p)->objclass <= args[1].field_1.n) {
      local_1069 = args[1].field_1.n <= (long)((args->field_1).p)->identifier;
    }
    value_00.field_1 =
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)(int)(uint)local_1069;
    value_00.isa = gravity_class_bool;
    gravity_vm_setslot(vm,value_00,rindex);
    vm_local._7_1_ = true;
  }
  else {
    snprintf(local_1048,0x1000,"A numeric value is expected.");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1048);
    value_01.field_1.n = 0;
    value_01.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_01,rindex);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool range_contains (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    gravity_range_t *range = VALUE_AS_RANGE(GET_VALUE(0));
    gravity_value_t value = GET_VALUE(1);

    // check error condition
    if (!VALUE_ISA_INT(value)) RETURN_ERROR("A numeric value is expected.");

    RETURN_VALUE(VALUE_FROM_BOOL((value.n >= range->from) && (value.n <= range->to)), rindex);
}